

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::ZoneBitVector::_resize
          (ZoneBitVector *this,ZoneAllocator *allocator,uint32_t newSize,uint32_t idealCapacity,
          bool newBitsValue)

{
  ulong *puVar1;
  void *pvVar2;
  sbyte sVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  void *p;
  size_t allocatedCapacity;
  
  if (idealCapacity < newSize) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/zonevector.cpp"
               ,0xbc,"idealCapacity >= newSize");
  }
  uVar8 = *(uint *)(this + 8);
  if (uVar8 < newSize) {
    p = *(void **)this;
    if (*(uint *)(this + 0xc) < newSize) {
      uVar6 = idealCapacity + 0x3f & 0xffffffc0;
      if (uVar6 < newSize) {
        return 1;
      }
      pvVar2 = ZoneAllocator::alloc(allocator,(ulong)(uVar6 >> 3),&allocatedCapacity);
      if (pvVar2 == (void *)0x0) {
        return 1;
      }
      uVar5 = allocatedCapacity * 8;
      if (uVar5 < allocatedCapacity) {
        uVar5 = (ulong)uVar6;
      }
      for (uVar4 = 0; uVar8 + 0x3f >> 6 != uVar4; uVar4 = uVar4 + 1) {
        *(undefined8 *)((long)pvVar2 + uVar4 * 8) = *(undefined8 *)((long)p + uVar4 * 8);
      }
      if (p != (void *)0x0) {
        ZoneAllocator::release(allocator,p,(ulong)(*(uint *)(this + 0xc) >> 3));
      }
      *(void **)this = pvVar2;
      *(int *)(this + 0xc) = (int)uVar5;
      p = pvVar2;
    }
    uVar7 = uVar8 >> 6;
    uVar5 = (ulong)uVar7;
    uVar6 = newSize & 0x3f;
    uVar8 = uVar8 & 0x3f;
    if (uVar8 != 0) {
      if (uVar7 == newSize >> 6) {
        sVar3 = (sbyte)uVar6;
        if (uVar6 <= uVar8) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/zonevector.cpp"
                     ,0x104,"startBit < endBit");
        }
      }
      else {
        sVar3 = 0;
      }
      puVar1 = (ulong *)((long)p + uVar5 * 8);
      *puVar1 = *puVar1 | -(ulong)newBitsValue << (sVar3 - (char)uVar8 & 0x3fU);
      uVar5 = (ulong)(uVar7 + 1);
    }
    uVar8 = newSize + 0x3f >> 6;
    for (; uVar5 < uVar8; uVar5 = uVar5 + 1) {
      *(ulong *)((long)p + uVar5 * 8) = -(ulong)newBitsValue;
    }
    if (uVar6 != 0) {
      uVar5 = 0;
      if (newBitsValue) {
        uVar5 = ~(-1L << (sbyte)uVar6);
      }
      *(ulong *)((long)p + (ulong)(uVar8 - 1) * 8) = uVar5;
    }
  }
  else if ((newSize & 0x3f) != 0) {
    puVar1 = (ulong *)(*(long *)this + (ulong)(newSize >> 6) * 8);
    *puVar1 = *puVar1 & ~(-1L << (sbyte)(newSize & 0x3f));
  }
  *(uint32_t *)(this + 8) = newSize;
  return 0;
}

Assistant:

Error ZoneBitVector::_resize(ZoneAllocator* allocator, uint32_t newSize, uint32_t idealCapacity, bool newBitsValue) noexcept {
  ASMJIT_ASSERT(idealCapacity >= newSize);

  if (newSize <= _size) {
    // The size after the resize is lesser than or equal to the current size.
    uint32_t idx = newSize / kBitWordSizeInBits;
    uint32_t bit = newSize % kBitWordSizeInBits;

    // Just set all bits outside of the new size in the last word to zero.
    // There is a case that there are not bits to set if `bit` is zero. This
    // happens when `newSize` is a multiply of `kBitWordSizeInBits` like 64, 128,
    // and so on. In that case don't change anything as that would mean settings
    // bits outside of the `_size`.
    if (bit)
      _data[idx] &= (BitWord(1) << bit) - 1u;

    _size = newSize;
    return kErrorOk;
  }

  uint32_t oldSize = _size;
  BitWord* data = _data;

  if (newSize > _capacity) {
    // Realloc needed, calculate the minimum capacity (in bytes) required.
    uint32_t minimumCapacityInBits = Support::alignUp<uint32_t>(idealCapacity, kBitWordSizeInBits);

    if (ASMJIT_UNLIKELY(minimumCapacityInBits < newSize))
      return DebugUtils::errored(kErrorOutOfMemory);

    // Normalize to bytes.
    uint32_t minimumCapacity = minimumCapacityInBits / 8;
    size_t allocatedCapacity;

    BitWord* newData = static_cast<BitWord*>(allocator->alloc(minimumCapacity, allocatedCapacity));
    if (ASMJIT_UNLIKELY(!newData))
      return DebugUtils::errored(kErrorOutOfMemory);

    // `allocatedCapacity` now contains number in bytes, we need bits.
    size_t allocatedCapacityInBits = allocatedCapacity * 8;

    // Arithmetic overflow should normally not happen. If it happens we just
    // change the `allocatedCapacityInBits` to the `minimumCapacityInBits` as
    // this value is still safe to be used to call `_allocator->release(...)`.
    if (ASMJIT_UNLIKELY(allocatedCapacityInBits < allocatedCapacity))
      allocatedCapacityInBits = minimumCapacityInBits;

    _copyBits(newData, data, _wordsPerBits(oldSize));

    if (data)
      allocator->release(data, _capacity / 8);
    data = newData;

    _data = data;
    _capacity = uint32_t(allocatedCapacityInBits);
  }

  // Start (of the old size) and end (of the new size) bits
  uint32_t idx = oldSize / kBitWordSizeInBits;
  uint32_t startBit = oldSize % kBitWordSizeInBits;
  uint32_t endBit = newSize % kBitWordSizeInBits;

  // Set new bits to either 0 or 1. The `pattern` is used to set multiple
  // bits per bit-word and contains either all zeros or all ones.
  BitWord pattern = Support::bitMaskFromBool<BitWord>(newBitsValue);

  // First initialize the last bit-word of the old size.
  if (startBit) {
    uint32_t nBits = 0;

    if (idx == (newSize / kBitWordSizeInBits)) {
      // The number of bit-words is the same after the resize. In that case
      // we need to set only bits necessary in the current last bit-word.
      ASMJIT_ASSERT(startBit < endBit);
      nBits = endBit - startBit;
    }
    else {
      // There is be more bit-words after the resize. In that case we don't
      // have to be extra careful about the last bit-word of the old size.
      nBits = kBitWordSizeInBits - startBit;
    }

    data[idx++] |= pattern << nBits;
  }

  // Initialize all bit-words after the last bit-word of the old size.
  uint32_t endIdx = _wordsPerBits(newSize);
  while (idx < endIdx) data[idx++] = pattern;

  // Clear unused bits of the last bit-word.
  if (endBit)
    data[endIdx - 1] = pattern & ((BitWord(1) << endBit) - 1);

  _size = newSize;
  return kErrorOk;
}